

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool __thiscall Function_Template::form2_Shift(Function_Template *this,ShiftForm2 Shift)

{
  bool bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM0_Qa;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 in_XMM3_Qb;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  ImageTemplate<unsigned_char> local_38;
  
  Unit_Test::intensityArray(&intensity,2);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_38,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&input,&intensity,&local_38);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_38);
  auVar9._0_8_ = (double)((input.
                           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_width >> 2);
  auVar9._8_8_ = in_XMM0_Qa;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar3 = vorpd_avx512vl(auVar9,auVar3);
  dVar5 = Unit_Test::randomFloatValue<double>(auVar3._0_8_,auVar9._0_8_,1.0);
  iVar2 = rand();
  auVar7._0_8_ = (double)(iVar2 % 100);
  auVar7._8_8_ = in_XMM3_Qb;
  auVar3 = vfmadd132sd_fma(auVar7,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  auVar10._0_8_ =
       (double)((input.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_height >> 2);
  auVar10._8_8_ = in_XMM3_Qb;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar4 = vorpd_avx512vl(auVar10,auVar4);
  dVar6 = Unit_Test::randomFloatValue<double>(auVar4._0_8_,auVar10._0_8_,1.0);
  iVar2 = rand();
  auVar8._0_8_ = (double)(iVar2 % 100);
  auVar8._8_8_ = in_XMM3_Qb;
  auVar4 = vfmadd132sd_fma(auVar8,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  (*(code *)this)(auVar3._0_8_ + dVar5,auVar4._0_8_ + dVar6,
                  input.
                  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  input.
                  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1);
  bVar1 = Unit_Test::verifyImage
                    (input.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,
                     *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool form2_Shift(ShiftForm2 Shift)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const double shiftX = randomFloatValue<double>( -static_cast<double>( input[0].width()  / 4 ), input[0].width() / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );
        const double shiftY = randomFloatValue<double>( -static_cast<double>( input[0].height() / 4 ), input[0].height() / 4, 1 ) + randomFloatValue<double>( 0, 1, 0.01 );

        Shift( input[0], input[1], shiftX, shiftY );

        return verifyImage( input[1], intensity[0] );
    }